

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O0

int KYBER_marshal_private_key(CBB *out,KYBER_private_key *private_key)

{
  int iVar1;
  uint8_t *local_30;
  uint8_t *s_output;
  private_key *priv;
  KYBER_private_key *private_key_local;
  CBB *out_local;
  
  priv = (private_key *)private_key;
  private_key_local = (KYBER_private_key *)out;
  s_output = (uint8_t *)anon_unknown.dwarf_217a0a::private_key_from_external(private_key);
  iVar1 = CBB_add_space((CBB *)private_key_local,&local_30,0x480);
  if (iVar1 != 0) {
    vector_encode(local_30,(vector *)(s_output + 0x1840),0xc);
    iVar1 = kyber_marshal_public_key((CBB *)private_key_local,(public_key *)s_output);
    if (((iVar1 != 0) &&
        (iVar1 = CBB_add_bytes((CBB *)private_key_local,s_output + 0x620,0x20), iVar1 != 0)) &&
       (iVar1 = CBB_add_bytes((CBB *)private_key_local,s_output + 0x1e40,0x20), iVar1 != 0)) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int KYBER_marshal_private_key(CBB *out,
                              const struct KYBER_private_key *private_key) {
  const struct private_key *const priv = private_key_from_external(private_key);
  uint8_t *s_output;
  if (!CBB_add_space(out, &s_output, kEncodedVectorSize)) {
    return 0;
  }
  vector_encode(s_output, &priv->s, kLog2Prime);
  if (!kyber_marshal_public_key(out, &priv->pub) ||
      !CBB_add_bytes(out, priv->pub.public_key_hash,
                     sizeof(priv->pub.public_key_hash)) ||
      !CBB_add_bytes(out, priv->fo_failure_secret,
                     sizeof(priv->fo_failure_secret))) {
    return 0;
  }
  return 1;
}